

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

bool google::protobuf::internal::anon_unknown_36::HasLazyRep
               (FieldDescriptor *field,FieldOptions *options)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  bool v1;
  
  if (field->type_ == '\v') {
    bVar1 = field->field_0x1;
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar2 != (Nonnull<const_char_*>)0x0) {
      _GLOBAL__N_1::HasLazyRep();
    }
    if ((field->field_0x1 & 0x20) == 0) {
      return options->lazy_opt != 0;
    }
  }
  return false;
}

Assistant:

bool HasLazyRep(const FieldDescriptor* field,
                const TailCallTableInfo::FieldOptions& options) {
  return field->type() == field->TYPE_MESSAGE && !field->is_repeated() &&
         options.lazy_opt != 0;
}